

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O0

bool __thiscall ON_OutlineFigure::Internal_HasValidEnds(ON_OutlineFigure *this,bool bLogErrors)

{
  bool bVar1;
  uint uVar2;
  ON_OutlineFigurePoint *pOVar3;
  bool bLogErrors_local;
  ON_OutlineFigure *this_local;
  
  uVar2 = ON_SimpleArray<ON_OutlineFigurePoint>::UnsignedCount(&this->m_points);
  if (1 < uVar2) {
    pOVar3 = ON_SimpleArray<ON_OutlineFigurePoint>::operator[](&this->m_points,0);
    bVar1 = ON_OutlineFigurePoint::IsBeginFigurePoint(pOVar3);
    if (bVar1) {
      pOVar3 = ON_SimpleArray<ON_OutlineFigurePoint>::Last(&this->m_points);
      bVar1 = ON_OutlineFigurePoint::IsEndFigurePoint(pOVar3);
      if (bVar1) {
        return true;
      }
    }
  }
  if (bLogErrors) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_glyph_outline.cpp"
               ,0x1e4,"","Invalid figure start or end information.");
  }
  return false;
}

Assistant:

bool ON_OutlineFigure::Internal_HasValidEnds(
  bool bLogErrors
) const
{
  if (m_points.UnsignedCount() >= 2
    && m_points[0].IsBeginFigurePoint()
    && m_points.Last()->IsEndFigurePoint()
    )
    return true;
  if (bLogErrors)
  {
    ON_ERROR("Invalid figure start or end information.");
  }
  return false;
}